

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool compare_wide_unions(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r2;
  long in_RDX;
  undefined8 *in_RDI;
  roaring_bitmap_t *t2;
  roaring_bitmap_t *t1;
  int i;
  roaring_bitmap_t *longtemporruns;
  roaring_bitmap_t *longtempornorun;
  roaring_bitmap_t *temporrunsheap;
  roaring_bitmap_t *tempornorunheap;
  roaring_bitmap_t *temporruns;
  roaring_bitmap_t *tempornorun;
  roaring_bitmap_t *in_stack_ffffffffffffff98;
  int line;
  roaring_bitmap_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  roaring_bitmap_t *in_stack_ffffffffffffffb0;
  roaring_bitmap_t *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  _Bool local_1;
  
  roaring_bitmap_or_many
            (CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (roaring_bitmap_t **)in_stack_ffffffffffffffa0);
  roaring_bitmap_or_many
            (CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (roaring_bitmap_t **)in_stack_ffffffffffffffa0);
  _Var1 = slow_bitmap_equals(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (_Var1) {
    roaring_bitmap_equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    roaring_bitmap_or_many_heap(rnorun._4_4_,rruns);
    bitmap1 = roaring_bitmap_or_many_heap(rnorun._4_4_,rruns);
    roaring_bitmap_equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    roaring_bitmap_equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    roaring_bitmap_free((roaring_bitmap_t *)0x1040d6);
    roaring_bitmap_free((roaring_bitmap_t *)0x1040e0);
    if (in_RDX == 1) {
      r1 = (roaring_bitmap_t *)*in_RDI;
    }
    else {
      roaring_bitmap_equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
      roaring_bitmap_equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      _assert_true((unsigned_long)in_stack_ffffffffffffffb0,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
      r1 = roaring_bitmap_or(temporruns,tempornorunheap);
      r2 = roaring_bitmap_or(temporruns,tempornorunheap);
      roaring_bitmap_equals(r1,r2);
      _assert_true((unsigned_long)r2,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                  );
      for (iVar2 = 2; line = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), iVar2 < (int)in_RDX;
          iVar2 = iVar2 + 1) {
        roaring_bitmap_equals(r1,r2);
        _assert_true((unsigned_long)r2,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                     (char *)in_stack_ffffffffffffffa0,line);
        roaring_bitmap_equals(r1,r2);
        _assert_true((unsigned_long)r2,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                     (char *)in_stack_ffffffffffffffa0,line);
        in_stack_ffffffffffffffa0 = roaring_bitmap_or(temporruns,tempornorunheap);
        in_stack_ffffffffffffff98 = roaring_bitmap_or(temporruns,tempornorunheap);
        roaring_bitmap_equals(r1,r2);
        _assert_true((unsigned_long)r2,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                     (char *)in_stack_ffffffffffffffa0,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        roaring_bitmap_free((roaring_bitmap_t *)0x1042cc);
        r1 = in_stack_ffffffffffffffa0;
        roaring_bitmap_free((roaring_bitmap_t *)0x1042e0);
        r2 = in_stack_ffffffffffffff98;
        roaring_bitmap_equals(r1,in_stack_ffffffffffffff98);
        _assert_true((unsigned_long)r2,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                     (char *)in_stack_ffffffffffffffa0,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
    }
    _Var1 = slow_bitmap_equals(bitmap1,r1);
    if (_Var1) {
      _Var1 = slow_bitmap_equals(bitmap1,r1);
      if (_Var1) {
        roaring_bitmap_free((roaring_bitmap_t *)0x104383);
        roaring_bitmap_free((roaring_bitmap_t *)0x10438d);
        roaring_bitmap_free((roaring_bitmap_t *)0x104397);
        roaring_bitmap_free((roaring_bitmap_t *)0x1043a1);
        local_1 = true;
      }
      else {
        printf("[compare_wide_unions] Unions don\'t agree! (runs) \n");
        local_1 = false;
      }
    }
    else {
      printf("[compare_wide_unions] Unions don\'t agree! (regular) \n");
      local_1 = false;
    }
  }
  else {
    printf("[compare_wide_unions] Unions don\'t agree! (fast run-norun) \n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool compare_wide_unions(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                         size_t count) {
    roaring_bitmap_t *tempornorun =
        roaring_bitmap_or_many(count, (const roaring_bitmap_t **)rnorun);
    roaring_bitmap_t *temporruns =
        roaring_bitmap_or_many(count, (const roaring_bitmap_t **)rruns);
    if (!slow_bitmap_equals(tempornorun, temporruns)) {
        printf("[compare_wide_unions] Unions don't agree! (fast run-norun) \n");
        return false;
    }
    assert_true(roaring_bitmap_equals(tempornorun, temporruns));

    roaring_bitmap_t *tempornorunheap =
        roaring_bitmap_or_many_heap(count, (const roaring_bitmap_t **)rnorun);
    roaring_bitmap_t *temporrunsheap =
        roaring_bitmap_or_many_heap(count, (const roaring_bitmap_t **)rruns);
    // assert_true(slow_bitmap_equals(tempornorun, tempornorunheap));
    // assert_true(slow_bitmap_equals(temporruns,temporrunsheap));

    assert_true(roaring_bitmap_equals(tempornorun, tempornorunheap));
    assert_true(roaring_bitmap_equals(temporruns, temporrunsheap));
    roaring_bitmap_free(tempornorunheap);
    roaring_bitmap_free(temporrunsheap);

    roaring_bitmap_t *longtempornorun;
    roaring_bitmap_t *longtemporruns;
    if (count == 1) {
        longtempornorun = rnorun[0];
        longtemporruns = rruns[0];
    } else {
        assert_true(roaring_bitmap_equals(rnorun[0], rruns[0]));
        assert_true(roaring_bitmap_equals(rnorun[1], rruns[1]));
        longtempornorun = roaring_bitmap_or(rnorun[0], rnorun[1]);
        longtemporruns = roaring_bitmap_or(rruns[0], rruns[1]);
        assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        for (int i = 2; i < (int)count; ++i) {
            assert_true(roaring_bitmap_equals(rnorun[i], rruns[i]));
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));

            roaring_bitmap_t *t1 =
                roaring_bitmap_or(rnorun[i], longtempornorun);
            roaring_bitmap_t *t2 = roaring_bitmap_or(rruns[i], longtemporruns);
            assert_true(roaring_bitmap_equals(t1, t2));
            roaring_bitmap_free(longtempornorun);
            longtempornorun = t1;
            roaring_bitmap_free(longtemporruns);
            longtemporruns = t2;
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        }
    }
    if (!slow_bitmap_equals(longtempornorun, tempornorun)) {
        printf("[compare_wide_unions] Unions don't agree! (regular) \n");
        return false;
    }
    if (!slow_bitmap_equals(temporruns, longtemporruns)) {
        printf("[compare_wide_unions] Unions don't agree! (runs) \n");
        return false;
    }
    roaring_bitmap_free(tempornorun);
    roaring_bitmap_free(temporruns);

    roaring_bitmap_free(longtempornorun);
    roaring_bitmap_free(longtemporruns);

    return true;
}